

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tes31Context.cpp
# Opt level: O2

void __thiscall deqp::gles31::Context::createRenderContext(Context *this)

{
  RenderContext *context;
  ContextInfo *pCVar1;
  
  context = glu::createDefaultRenderContext
                      (this->m_testCtx->m_platform,this->m_testCtx->m_cmdLine,(ApiType)0x23);
  this->m_renderCtx = context;
  pCVar1 = glu::ContextInfo::create(context);
  this->m_contextInfo = pCVar1;
  return;
}

Assistant:

void Context::createRenderContext (void)
{
	DE_ASSERT(!m_renderCtx && !m_contextInfo);

	try
	{
		try
		{
			m_renderCtx		= glu::createDefaultRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), glu::ApiType::es(3, 2));
		}
		catch (...)
		{
			m_renderCtx		= glu::createDefaultRenderContext(m_testCtx.getPlatform(), m_testCtx.getCommandLine(), glu::ApiType::es(3, 1));
		}
		m_contextInfo	= glu::ContextInfo::create(*m_renderCtx);
	}
	catch (...)
	{
		destroyRenderContext();
		throw;
	}
}